

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O2

oonf_layer2_neighbor_address * oonf_layer2_net_get_best_neighbor_match(netaddr *addr)

{
  code cVar1;
  bool bVar2;
  uint uVar3;
  char cVar4;
  uint uVar5;
  code *pcVar6;
  _func_int_void_ptr_void_ptr **pp_Var7;
  avl_tree *paVar8;
  oonf_layer2_neighbor_address *best_match;
  oonf_layer2_neighbor_address *local_38;
  
  paVar8 = &_oonf_layer2_net_tree;
  uVar5 = 0x100;
  local_38 = (oonf_layer2_neighbor_address *)0x0;
  while (paVar8 = (avl_tree *)(paVar8->list_head).next,
        (paVar8->list_head).prev != _oonf_layer2_net_tree.list_head.prev) {
    pp_Var7 = &paVar8[-0x2e].comp;
    while (pp_Var7 = (_func_int_void_ptr_void_ptr **)*pp_Var7,
          (list_entity *)pp_Var7[1] != paVar8[-0x2d].list_head.next) {
      pcVar6 = (code *)(pp_Var7 + -0x88);
      while (pcVar6 = *(code **)pcVar6,
            (_func_int_void_ptr_void_ptr *)*(long *)(pcVar6 + 8) != pp_Var7[-0x87]) {
        cVar4 = netaddr_is_in_subnet((oonf_layer2_neighbor_address *)(pcVar6 + -0x60),addr);
        if (cVar4 != '\0') {
          cVar1 = pcVar6[-0x4f];
          uVar3 = uVar5;
          if ((byte)cVar1 <= uVar5) {
            uVar3 = (uint)(byte)cVar1;
          }
          bVar2 = (byte)cVar1 < uVar5;
          uVar5 = uVar3;
          if (bVar2) {
            local_38 = (oonf_layer2_neighbor_address *)(pcVar6 + -0x60);
          }
        }
      }
    }
  }
  return local_38;
}

Assistant:

struct oonf_layer2_neighbor_address *
oonf_layer2_net_get_best_neighbor_match(const struct netaddr *addr) {
  struct oonf_layer2_neighbor_address *best_match, *l2addr;
  struct oonf_layer2_neigh *l2neigh;
  struct oonf_layer2_net *l2net;
  int prefix_length;

  prefix_length = 256;
  best_match = NULL;

  avl_for_each_element(&_oonf_layer2_net_tree, l2net, _node) {
    avl_for_each_element(&l2net->neighbors, l2neigh, _node) {
      avl_for_each_element(&l2neigh->remote_neighbor_ips, l2addr, _neigh_node) {
        if (netaddr_is_in_subnet(&l2addr->ip, addr) && netaddr_get_prefix_length(&l2addr->ip) < prefix_length) {
          best_match = l2addr;
          prefix_length = netaddr_get_prefix_length(&l2addr->ip);
        }
      }
    }
  }
  return best_match;
}